

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O1

bool google::protobuf::internal::
     HandleEnum<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandler,(google::protobuf::internal::Cardinality)3>
               (ParseTable *table,CodedInputStream *input,MessageLite *msg,uint32 *presence,
               uint32 presence_index,int64 offset,uint32 tag,int field_number)

{
  byte bVar1;
  byte *pbVar2;
  EnumValidator p_Var3;
  long *plVar4;
  undefined8 *puVar5;
  bool bVar6;
  ulong uVar7;
  ParseTableField *pPVar8;
  undefined8 *puVar9;
  void *pvVar10;
  uint uVar11;
  uint32 first_byte_or_zero;
  int value;
  bool bVar12;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar7 = (ulong)bVar1;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      bVar12 = true;
      goto LAB_0020ad4f;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar12 = -1 < (long)uVar7;
LAB_0020ad4f:
  if (bVar12 != false) {
    p_Var3 = table->aux[field_number].enums.validator;
    value = (int)uVar7;
    if ((p_Var3 == (EnumValidator)0x0) || (bVar6 = (*p_Var3)(value), bVar6)) {
      pPVar8 = table->fields + presence[presence_index];
      pvVar10 = (msg->_internal_metadata_).ptr_;
      if (((ulong)pvVar10 & 1) != 0) {
        pvVar10 = *(void **)((ulong)pvVar10 & 0xfffffffffffffffe);
      }
      uVar11 = pPVar8->processing_type & 0x1f;
      if (uVar11 - 0x17 < 2) {
        puVar9 = (undefined8 *)((long)&msg->_vptr_MessageLite + (ulong)pPVar8->offset);
        puVar5 = (undefined8 *)*puVar9;
        if (puVar5 != puVar9 + 2) {
          operator_delete(puVar5);
        }
      }
      else if ((uVar11 == 9) || (uVar11 == 0xc)) {
        if ((pvVar10 == (void *)0x0) &&
           (puVar5 = *(undefined8 **)((long)&msg->_vptr_MessageLite + (ulong)pPVar8->offset),
           puVar5 != (undefined8 *)0x0 && puVar5 != &fixed_address_empty_string_abi_cxx11_)) {
          if ((undefined8 *)*puVar5 != puVar5 + 2) {
            operator_delete((undefined8 *)*puVar5);
          }
          operator_delete(puVar5);
        }
      }
      else if (((uVar11 == 0xb) && (pvVar10 == (void *)0x0)) &&
              (plVar4 = *(long **)((long)&msg->_vptr_MessageLite + (ulong)pPVar8->offset),
              plVar4 != (long *)0x0)) {
        (**(code **)(*plVar4 + 8))();
      }
      presence[presence_index] = field_number;
      *(int *)((long)&msg->_vptr_MessageLite + offset) = value;
    }
    else {
      anon_unknown_16::UnknownFieldHandler::Varint(msg,table,tag,value);
    }
  }
  return bVar12;
}

Assistant:

inline bool HandleEnum(const ParseTable& table, io::CodedInputStream* input,
                       MessageLite* msg, uint32* presence,
                       uint32 presence_index, int64 offset, uint32 tag,
                       int field_number) {
  int value;
  if (PROTOBUF_PREDICT_FALSE(
          (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
              input, &value)))) {
    return false;
  }

  AuxillaryParseTableField::EnumValidator validator =
      table.aux[field_number].enums.validator;
  if (validator == nullptr || validator(value)) {
    switch (cardinality) {
      case Cardinality_SINGULAR:
        SetField(msg, presence, presence_index, offset, value);
        break;
      case Cardinality_REPEATED:
        AddField(msg, offset, value);
        break;
      case Cardinality_ONEOF:
        ClearOneofField(table.fields[presence[presence_index]], msg->GetArena(),
                        msg);
        SetOneofField(msg, presence, presence_index, offset, field_number,
                      value);
        break;
      default:
        PROTOBUF_ASSUME(false);
    }
  } else {
    UnknownFieldHandler::Varint(msg, table, tag, value);
  }

  return true;
}